

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<int>::Clear
          (RepeatedFieldWrapper<int> *this,Field *data)

{
  RepeatedField<int> *this_00;
  
  this_00 = (RepeatedField<int> *)(**(code **)(*(long *)this + 0x88))();
  RepeatedField<int>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }